

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testReader.cpp
# Opt level: O2

int test(lefrCallbackType_e type,lefiMacro *pModel,void *pData)

{
  char cVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  bool bVar6;
  double dVar7;
  lefiPin tpin;
  
  LefDefParser::lefiPin::lefiPin(&tpin);
  iVar2 = LefDefParser::lefiMacro::numProperties(pModel);
  poVar4 = std::operator<<((ostream *)&std::cout,"Call test");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"type");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,type);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  pcVar5 = (char *)LefDefParser::lefiMacro::name(pModel);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  pcVar5 = (char *)LefDefParser::lefiMacro::macroClass(pModel);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  pcVar5 = (char *)LefDefParser::lefiMacro::clockType(pModel);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  pcVar5 = (char *)LefDefParser::lefiMacro::foreignName(pModel,0);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  pcVar5 = (char *)LefDefParser::lefiMacro::generator(pModel);
  poVar4 = std::operator<<(poVar4,pcVar5);
  poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
  iVar3 = LefDefParser::lefiMacro::hasSize(pModel);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  if (iVar2 != 0) {
    bVar6 = true;
    iVar3 = 0;
    while (iVar3 < iVar2) {
      if (!bVar6) {
        __assert_fail("i < 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/test/testReader.cpp"
                      ,0x19,"int test(lefrCallbackType_e, lefiMacro *, void *)");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"[Property Name]");
      pcVar5 = (char *)LefDefParser::lefiMacro::propName(pModel,0);
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      std::operator<<(poVar4,"[Property Num]");
      dVar7 = (double)LefDefParser::lefiMacro::propNum(pModel,0);
      poVar4 = std::ostream::_M_insert<double>(dVar7);
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"[Property Type]");
      cVar1 = LefDefParser::lefiMacro::propType(pModel,0);
      poVar4 = std::operator<<(poVar4,cVar1);
      bVar6 = false;
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar3 = 1;
    }
  }
  LefDefParser::lefiPin::~lefiPin(&tpin);
  return 0;
}

Assistant:

int test(lefrCallbackType_e type, lefiMacro *pModel, lefiUserData pData) {
    auto & model = *pModel;
    auto & data = *(int *)pData;
    lefiPin tpin;
    int numProps = model.numProperties();
    //std::cout << numProps << std::endl;
    std ::cout<<"Call test"<< std::endl;
    std::cout << "type" << type << std::endl
        <<model.name()<<std::endl
        <<model.macroClass() << std::endl
        <<model.clockType() << std::endl
        <<model.foreignName() << std::endl
        <<model.generator() << std::endl
        <<model.hasSize() << std::endl;
    int i, j =numProps;
    if( numProps == 0)return 0;
    for (i = 0;i < numProps;i++) {
        assert(i < 1);
        std::cout << "[Property Name]" << (model.propName(i)) << std::endl
                  << "[Property Num]" << model.propNum(i) << std::endl
                  << "[Property Type]" << model.propType(i) << std::endl;
    }
    return 0;
}